

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>> *in_RDI;
  basic_format_specs<wchar_t> *in_stack_00000038;
  uint num_digits;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *in_stack_00000048;
  bin_writer<3> in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  
  uVar2 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
          int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::count_digits<3u>(in_RDI);
  bVar1 = basic_format_specs<wchar_t>::flag(*(basic_format_specs<wchar_t> **)(in_RDI + 8),8);
  if ((bVar1) &&
     (iVar3 = basic_format_specs<wchar_t>::precision(*(basic_format_specs<wchar_t> **)(in_RDI + 8)),
     iVar3 <= (int)uVar2)) {
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x14] =
         (int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>)0x30;
  }
  get_prefix((int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *)0x154b5c);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
            (in_stack_00000048,this._4_4_,(string_view)in_stack_00000058,in_stack_00000038,
             in_stack_00000050);
  return;
}

Assistant:

void on_oct() {
      unsigned num_digits = count_digits<3>();
      if (spec.flag(HASH_FLAG) &&
          spec.precision() <= static_cast<int>(num_digits)) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }